

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktClippingTests.cpp
# Opt level: O2

void vkt::clipping::anon_unknown_0::ClipDistanceComplementarity::initPrograms
               (SourceCollections *programCollection,int numClipDistances)

{
  SourceCollections *this;
  char *pcVar1;
  ostream *poVar2;
  ProgramSources *pPVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  allocator<char> local_219;
  SourceCollections *local_218;
  string local_210;
  string local_1f0;
  undefined1 local_1d0 [40];
  ostringstream src;
  
  local_218 = programCollection;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar1 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  poVar2 = std::operator<<((ostream *)&src,pcVar1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,
                           "layout(location = 0) in vec4 v_position;    // we are passing ClipDistance in w component\n"
                          );
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"out gl_PerVertex {\n");
  poVar2 = std::operator<<(poVar2,"    vec4  gl_Position;\n");
  poVar2 = std::operator<<(poVar2,"    float gl_ClipDistance[");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,numClipDistances);
  poVar2 = std::operator<<(poVar2,"];\n");
  poVar2 = std::operator<<(poVar2,"};\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"void main (void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  std::operator<<(poVar2,"    gl_Position        = vec4(v_position.xyz, 1.0);\n");
  iVar5 = numClipDistances + -1;
  iVar6 = 0;
  iVar4 = 0;
  if (0 < iVar5) {
    iVar4 = iVar5;
  }
  for (; iVar4 != iVar6; iVar6 = iVar6 + 1) {
    poVar2 = std::operator<<((ostream *)&src,"    gl_ClipDistance[");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar6);
    std::operator<<(poVar2,"] = 0.0;\n");
  }
  poVar2 = std::operator<<((ostream *)&src,"    gl_ClipDistance[");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar5);
  poVar2 = std::operator<<(poVar2,"] = v_position.w;\n");
  std::operator<<(poVar2,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"vert",&local_219);
  this = local_218;
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add(&local_218->glslSources,&local_1f0);
  std::__cxx11::stringbuf::str();
  glu::VertexSource::VertexSource((VertexSource *)local_1d0,&local_210);
  glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_1d0);
  std::__cxx11::string::~string((string *)(local_1d0 + 8));
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar1 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  poVar2 = std::operator<<((ostream *)&src,pcVar1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) out vec4 o_color;\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"void main (void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"    o_color = vec4(1.0, 1.0, 1.0, 0.5);\n");
  std::operator<<(poVar2,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"frag",&local_219);
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add(&this->glslSources,&local_1f0);
  std::__cxx11::stringbuf::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)local_1d0,&local_210);
  glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_1d0);
  std::__cxx11::string::~string((string *)(local_1d0 + 8));
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  return;
}

Assistant:

void initPrograms (SourceCollections& programCollection, const int numClipDistances)
{
	// Vertex shader
	{
		DE_ASSERT(numClipDistances > 0);
		const int clipDistanceLastNdx = numClipDistances - 1;

		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(location = 0) in vec4 v_position;    // we are passing ClipDistance in w component\n"
			<< "\n"
			<< "out gl_PerVertex {\n"
			<< "    vec4  gl_Position;\n"
			<< "    float gl_ClipDistance[" << numClipDistances << "];\n"
			<< "};\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    gl_Position        = vec4(v_position.xyz, 1.0);\n";
		for (int i = 0; i < clipDistanceLastNdx; ++i)
			src << "    gl_ClipDistance[" << i << "] = 0.0;\n";
		src << "    gl_ClipDistance[" << clipDistanceLastNdx << "] = v_position.w;\n"
			<< "}\n";

		programCollection.glslSources.add("vert") << glu::VertexSource(src.str());
	}

	// Fragment shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(location = 0) out vec4 o_color;\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    o_color = vec4(1.0, 1.0, 1.0, 0.5);\n"
			<< "}\n";

		programCollection.glslSources.add("frag") << glu::FragmentSource(src.str());
	}
}